

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_store_fpr_D(DisasContext_conflict8 *dc,uint dst,TCGv_i32 v)

{
  TCGContext_conflict8 *tcg_ctx_00;
  uint rd;
  TCGContext_conflict8 *tcg_ctx;
  TCGv_i32 v_local;
  uint dst_local;
  DisasContext_conflict8 *dc_local;
  
  tcg_ctx_00 = dc->uc->tcg_ctx;
  rd = (dst & 1) << 5 | dst & 0x1e;
  tcg_gen_mov_i64_sparc64(tcg_ctx_00,(TCGv_i32)tcg_ctx_00->cpu_fpr[rd >> 1],v);
  gen_update_fprs_dirty(dc,rd);
  return;
}

Assistant:

static void gen_store_fpr_D(DisasContext *dc, unsigned int dst, TCGv_i64 v)
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;
    dst = DFPREG(dst);
    tcg_gen_mov_i64(tcg_ctx, tcg_ctx->cpu_fpr[dst / 2], v);
    gen_update_fprs_dirty(dc, dst);
}